

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::TextBasedObject::Dump(TextBasedObject *this,FILE *stream)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  UTF16String *this_00;
  char local_98 [8];
  char identbuf [128];
  FILE *stream_local;
  TextBasedObject *this_local;
  
  local_98[0] = '\0';
  identbuf._120_8_ = stream;
  if (stream == (FILE *)0x0) {
    identbuf._120_8_ = _stderr;
  }
  DescriptiveObject::Dump(&this->super_DescriptiveObject,(FILE *)identbuf._120_8_);
  uVar1 = identbuf._120_8_;
  pcVar3 = UL::EncodeString(&this->PayloadSchemeID,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","PayloadSchemeID",pcVar3);
  uVar1 = identbuf._120_8_;
  pcVar3 = UTF16String::EncodeString(&this->TextMIMEMediaType,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","TextMIMEMediaType",pcVar3);
  uVar1 = identbuf._120_8_;
  pcVar3 = UTF16String::EncodeString(&this->RFC5646TextLanguageCode,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","RFC5646TextLanguageCode",pcVar3);
  bVar2 = optional_property<ASDCP::MXF::UTF16String>::empty(&this->TextDataDescription);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    this_00 = optional_property<ASDCP::MXF::UTF16String>::get(&this->TextDataDescription);
    pcVar3 = UTF16String::EncodeString(this_00,local_98,0x80);
    fprintf((FILE *)uVar1,"  %22s = %s\n","TextDataDescription",pcVar3);
  }
  return;
}

Assistant:

void
TextBasedObject::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  DescriptiveObject::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "PayloadSchemeID", PayloadSchemeID.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "TextMIMEMediaType", TextMIMEMediaType.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %s\n",  "RFC5646TextLanguageCode", RFC5646TextLanguageCode.EncodeString(identbuf, IdentBufferLen));
  if ( ! TextDataDescription.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "TextDataDescription", TextDataDescription.get().EncodeString(identbuf, IdentBufferLen));
  }
}